

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool __thiscall
cmLocalGenerator::GetShouldUseOldFlags(cmLocalGenerator *this,bool shared,string *lang)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *__lhs;
  ostream *poVar3;
  PolicyID id;
  byte bVar4;
  undefined7 in_register_00000031;
  string flagsVar;
  string local_1d0;
  string originalFlags;
  ostringstream e;
  
  cmGlobalGenerator::GetSharedLibFlagsForLanguage(&originalFlags,this->GlobalGenerator,lang);
  if ((int)CONCAT71(in_register_00000031,shared) != 0) {
    std::__cxx11::string::string((string *)&flagsVar,"CMAKE_SHARED_LIBRARY_",(allocator *)&e);
    std::__cxx11::string::append((string *)&flagsVar);
    std::__cxx11::string::append((char *)&flagsVar);
    __lhs = cmMakefile::GetSafeDefinition(this->Makefile,&flagsVar);
    if (__lhs == (char *)0x0) {
LAB_0030517d:
      bVar4 = shared;
      bVar1 = true;
    }
    else {
      bVar1 = std::operator!=(__lhs,&originalFlags);
      if (!bVar1) goto LAB_0030517d;
      PVar2 = GetPolicyStatus(this,CMP0018);
      if (PVar2 - NEW < 3) {
        bVar4 = 0;
      }
      else {
        bVar4 = 1;
        if (PVar2 != OLD) {
          shared = (bool)1;
          if (PVar2 != WARN) goto LAB_0030517d;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar3 = std::operator<<((ostream *)&e,"Variable ");
          poVar3 = std::operator<<(poVar3,(string *)&flagsVar);
          poVar3 = std::operator<<(poVar3,
                                   " has been modified. CMake will ignore the POSITION_INDEPENDENT_CODE target property for shared libraries and will use the "
                                  );
          poVar3 = std::operator<<(poVar3,(string *)&flagsVar);
          poVar3 = std::operator<<(poVar3,
                                   " variable instead.  This may cause errors if the original content of "
                                  );
          poVar3 = std::operator<<(poVar3,(string *)&flagsVar);
          poVar3 = std::operator<<(poVar3," was removed.\n");
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0x12,id);
          std::operator<<(poVar3,(string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::stringbuf::str();
          IssueMessage(this,AUTHOR_WARNING,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
      }
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&flagsVar);
    if (!bVar1) goto LAB_0030518f;
  }
  bVar4 = 0;
LAB_0030518f:
  std::__cxx11::string::~string((string *)&originalFlags);
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmLocalGenerator::GetShouldUseOldFlags(bool shared,
                                            const std::string& lang) const
{
  std::string originalFlags =
    this->GlobalGenerator->GetSharedLibFlagsForLanguage(lang);
  if (shared) {
    std::string flagsVar = "CMAKE_SHARED_LIBRARY_";
    flagsVar += lang;
    flagsVar += "_FLAGS";
    const char* flags = this->Makefile->GetSafeDefinition(flagsVar);

    if (flags && flags != originalFlags) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0018)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          e << "Variable " << flagsVar
            << " has been modified. CMake "
               "will ignore the POSITION_INDEPENDENT_CODE target property for "
               "shared libraries and will use the "
            << flagsVar
            << " variable "
               "instead.  This may cause errors if the original content of "
            << flagsVar << " was removed.\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0018);

          this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          return true;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          return false;
      }
    }
  }
  return false;
}